

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandLutmin(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nLutSize;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nLutSize = 4;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Kvh"), iVar4 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        pcVar3 = "Empty network.\n";
      }
      else {
        pAVar2 = Abc_NtkLutmin(pAVar2,nLutSize,fVerbose);
        if (pAVar2 != (Abc_Ntk_t *)0x0) {
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
          return 0;
        }
        pcVar3 = "The command has failed.\n";
      }
      iVar4 = -1;
      goto LAB_00221b4d;
    }
    if (iVar1 != 0x4b) goto LAB_00221aca;
    if (argc <= globalUtilOptind) break;
    nLutSize = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
  }
  Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
LAB_00221aca:
  iVar4 = -2;
  Abc_Print(-2,"usage: lutmin [-K <num>] [-vh]\n");
  Abc_Print(-2,"\t           perform FPGA mapping while minimizing the LUT count\n");
  Abc_Print(-2,"\t           as described in the paper T. Sasao and A. Mishchenko:\n");
  Abc_Print(-2,"\t           \"On the number of LUTs to implement logic functions\".\n");
  Abc_Print(-2,"\t-K <num> : the LUT size to use for the mapping (2 <= num) [default = %d]\n",
            (ulong)nLutSize);
  pcVar3 = "yes";
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar3);
  pcVar3 = "\t-h       : print the command usage\n";
LAB_00221b4d:
  Abc_Print(iVar4,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandLutmin( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int nLutSize;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkLutmin( Abc_Ntk_t * pNtk, int nLutSize, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nLutSize = 4;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Kvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    // modify the current network
    pNtkRes = Abc_NtkLutmin( pNtk, nLutSize, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: lutmin [-K <num>] [-vh]\n" );
    Abc_Print( -2, "\t           perform FPGA mapping while minimizing the LUT count\n" );
    Abc_Print( -2, "\t           as described in the paper T. Sasao and A. Mishchenko:\n" );
    Abc_Print( -2, "\t           \"On the number of LUTs to implement logic functions\".\n" );
    Abc_Print( -2, "\t-K <num> : the LUT size to use for the mapping (2 <= num) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}